

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bech32.cpp
# Opt level: O0

void anon_unknown.dwarf_3638a::rejectBStringMixedCase(string *bstring)

{
  bool bVar1;
  bool bVar2;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var3;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var4;
  runtime_error *this;
  bool atLeastOneLower;
  bool atLeastOneUpper;
  string *bstring_local;
  
  _Var3._M_current = (char *)std::__cxx11::string::begin();
  _Var4._M_current = (char *)std::__cxx11::string::end();
  bVar1 = std::
          any_of<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,int(*)(int)noexcept>
                    (_Var3,_Var4,isupper);
  _Var3._M_current = (char *)std::__cxx11::string::begin();
  _Var4._M_current = (char *)std::__cxx11::string::end();
  bVar2 = std::
          any_of<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,int(*)(int)noexcept>
                    (_Var3,_Var4,islower);
  if ((bVar1) && (bVar2)) {
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this,"bech32 string is mixed case");
    __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  return;
}

Assistant:

void rejectBStringMixedCase(const std::string &bstring) {
        bool atLeastOneUpper = std::any_of(bstring.begin(), bstring.end(), &::isupper);
        bool atLeastOneLower = std::any_of(bstring.begin(), bstring.end(), &::islower);
        if(atLeastOneUpper && atLeastOneLower) {
            throw std::runtime_error("bech32 string is mixed case");
        }
    }